

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult pmreg_access_selr(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  CPAccessResult CVar2;
  
  if ((env->features & 0x8000000) != 0) {
    iVar1 = arm_current_el(env);
    if ((iVar1 == 0) && (((env->cp15).c9_pmuserenr & 8) != 0)) {
      return CP_ACCESS_OK;
    }
  }
  CVar2 = pmreg_access(env,ri,false);
  return CVar2;
}

Assistant:

static CPAccessResult pmreg_access_selr(CPUARMState *env,
                                        const ARMCPRegInfo *ri,
                                        bool isread)
{
    /* ER: event counter read trap control */
    if (arm_feature(env, ARM_FEATURE_V8)
        && arm_current_el(env) == 0
        && (env->cp15.c9_pmuserenr & (1 << 3)) != 0) {
        return CP_ACCESS_OK;
    }

    return pmreg_access(env, ri, isread);
}